

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O1

void ast::Sections::set_section(string *section_name)

{
  size_t __n;
  pointer pcVar1;
  int iVar2;
  Section *pSVar3;
  Section **ppSVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  Section *local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  iVar2 = std::__cxx11::string::compare((char *)section_name);
  if (iVar2 == 0) {
    uVar5 = 2;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)section_name);
    uVar5 = (uint)(iVar2 != 0);
  }
  ppSVar4 = table;
  lVar6 = (long)DAT_0013da98._M_current - (long)table;
  if ((lVar6 == 8) && ((*table)->content_size == 0)) {
    std::__cxx11::string::_M_assign((string *)*table);
    if (DAT_0013da98._M_current == table) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    (*table)->flags = uVar5;
  }
  else {
    if (DAT_0013da98._M_current == table) {
      uVar7 = 0;
    }
    else {
      __n = section_name->_M_string_length;
      uVar8 = 0;
      do {
        pSVar3 = ppSVar4[uVar8];
        if ((__n == (pSVar3->name)._M_string_length) &&
           ((__n == 0 ||
            (iVar2 = bcmp((section_name->_M_dataplus)._M_p,(pSVar3->name)._M_dataplus._M_p,__n),
            iVar2 == 0)))) {
          ppSVar4 = ppSVar4 + uVar8;
          goto LAB_0012360f;
        }
        uVar7 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar7;
      } while (uVar8 < (ulong)(lVar6 >> 3));
    }
    pSVar3 = (Section *)operator_new(0x40);
    pcVar1 = (section_name->_M_dataplus)._M_p;
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + section_name->_M_string_length);
    (pSVar3->name)._M_dataplus._M_p = (pointer)&(pSVar3->name).field_2;
    std::__cxx11::string::_M_construct<char*>((string *)pSVar3,local_50,local_50 + local_48);
    pSVar3->number = uVar7;
    pSVar3->base_address = 0;
    pSVar3->flags = uVar5;
    pSVar3->content_capacity = 0;
    pSVar3->content_size = 0;
    pSVar3->content = (uint8_t *)0x0;
    local_58 = pSVar3;
    if (DAT_0013da98._M_current == DAT_0013daa0) {
      std::vector<ast::Section*,std::allocator<ast::Section*>>::_M_realloc_insert<ast::Section*>
                ((vector<ast::Section*,std::allocator<ast::Section*>> *)&table,DAT_0013da98,
                 &local_58);
    }
    else {
      *DAT_0013da98._M_current = pSVar3;
      DAT_0013da98._M_current = DAT_0013da98._M_current + 1;
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
    ppSVar4 = DAT_0013da98._M_current + -1;
LAB_0012360f:
    current_section = *ppSVar4;
  }
  return;
}

Assistant:

void Sections::set_section(std::string section_name)
{
	unsigned section_flags = 0;
	if (section_name == ".bss")
		section_flags = Section::BSS;
	else if (section_name == ".stack")
		;
	else
		section_flags = Section::LOADABLE;

	/* A secção .text é sempre criada inicialmente.
	 * Se o utilizador não definir uma secção inicial esta é utilizada.
	 * Se o utilizador começar por definir uma secção,
	 * esta vai substituir a secção .text inicialmente criada.
	 */
	if (table.size() == 1 && table.at(0)->content_size == 0) {
		table.at(0)->name = section_name;
		table.at(0)->flags = section_flags;
		return;
	}

	unsigned section_number;
	for (section_number = 0; section_number < table.size(); ++section_number)
		if (section_name == table.at(section_number)->name) {
			current_section = table.at(section_number);
			return;	/* A secção já existe */
		}
	/* Cria a nova secção */
	table.push_back(new Section {section_name, section_number, section_flags});
	current_section = table.back();
}